

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DynamicCastMessageInvalidReferenceType_Test::
~LiteTest_DynamicCastMessageInvalidReferenceType_Test
          (LiteTest_DynamicCastMessageInvalidReferenceType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LiteTest, DynamicCastMessageInvalidReferenceType) {
  CastType1 test_type_1;
  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
#if defined(ABSL_HAVE_EXCEPTIONS)
  EXPECT_THROW(DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
               std::bad_cast);
#elif defined(GTEST_HAS_DEATH_TEST)
  ASSERT_DEATH(
      DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
#else
  (void)test_type_1;
  (void)test_type_1_pointer_const_ref;
  GTEST_SKIP() << "Can't test the failure.";
#endif
}